

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O0

QRect __thiscall
QFusionStyle::subElementRect(QFusionStyle *this,SubElement sr,QStyleOption *opt,QWidget *w)

{
  long lVar1;
  QStyleOptionDockWidget *this_00;
  QStyleOption *in_RDX;
  int in_ESI;
  long in_FS_OFFSET;
  QRect QVar2;
  bool verticalTitleBar;
  QStyleOptionDockWidget *titlebar;
  QRect r;
  QWidget *in_stack_00000508;
  QStyleOption *in_stack_00000510;
  SubElement in_stack_0000051c;
  QCommonStyle *in_stack_00000520;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffac;
  uint dx1;
  QRect *in_stack_ffffffffffffffb0;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2 = QCommonStyle::subElementRect
                    (in_stack_00000520,in_stack_0000051c,in_stack_00000510,in_stack_00000508);
  if (in_ESI == 1) {
    QRect::adjust(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,1,in_stack_ffffffffffffffa4,
                  in_stack_ffffffffffffffa0);
  }
  else {
    if (in_ESI - 0xcU < 3) {
      local_18._0_4_ = (in_RDX->rect).x1;
      local_18._4_4_ = (in_RDX->rect).y1;
      local_10._0_4_ = (in_RDX->rect).x2;
      local_10._4_4_ = (in_RDX->rect).y2;
      goto LAB_004f74d9;
    }
    if ((in_ESI == 0x1e) &&
       (this_00 = qstyleoption_cast<QStyleOptionDockWidget_const*>(in_RDX),
       this_00 != (QStyleOptionDockWidget *)0x0)) {
      dx1 = CONCAT13(this_00->verticalTitleBar,(int3)in_stack_ffffffffffffffac) & 0x1ffffff;
      if ((char)(dx1 >> 0x18) == '\0') {
        if (in_RDX->direction == LeftToRight) {
          QRect::adjust((QRect *)this_00,dx1,in_ESI,in_stack_ffffffffffffffa4,
                        in_stack_ffffffffffffffa0);
        }
        else {
          QRect::adjust((QRect *)this_00,dx1,in_ESI,in_stack_ffffffffffffffa4,
                        in_stack_ffffffffffffffa0);
        }
      }
      else {
        QRect::adjust((QRect *)this_00,dx1,in_ESI,in_stack_ffffffffffffffa4,
                      in_stack_ffffffffffffffa0);
      }
    }
  }
  local_28 = QVar2._0_8_;
  local_18 = local_28;
  uStack_20 = QVar2._8_8_;
  local_10 = uStack_20;
LAB_004f74d9:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  QVar2.x2.m_i = (int)local_10;
  QVar2.x1.m_i = (undefined4)local_18;
  QVar2.y1.m_i = local_18._4_4_;
  QVar2.y2.m_i = (int)((ulong)local_10 >> 0x20);
  return QVar2;
}

Assistant:

QRect QFusionStyle::subElementRect(SubElement sr, const QStyleOption *opt, const QWidget *w) const
{
    QRect r = QCommonStyle::subElementRect(sr, opt, w);
    switch (sr) {
    case SE_ProgressBarLabel:
    case SE_ProgressBarContents:
    case SE_ProgressBarGroove:
        return opt->rect;
    case SE_PushButtonFocusRect:
        r.adjust(0, 1, 0, -1);
        break;
    case SE_DockWidgetTitleBarText: {
        if (const QStyleOptionDockWidget *titlebar = qstyleoption_cast<const QStyleOptionDockWidget*>(opt)) {
            bool verticalTitleBar = titlebar->verticalTitleBar;
            if (verticalTitleBar) {
                r.adjust(0, 0, 0, -4);
            } else {
                if (opt->direction == Qt::LeftToRight)
                    r.adjust(4, 0, 0, 0);
                else
                    r.adjust(0, 0, -4, 0);
            }
        }

        break;
    }
    default:
        break;
    }
    return r;
}